

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

bool __thiscall QLabel::event(QLabel *this,QEvent *e)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  QLabelPrivate *this_00;
  Data *pDVar4;
  byte bVar5;
  bool bVar6;
  FocusPolicy FVar7;
  QAbstractButton *this_01;
  QWidget *pQVar8;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 100) {
    if (uVar1 == 0xe) {
      if (this_00->control != (QWidgetTextControl *)0x0) {
        this_00->field_0x340 = this_00->field_0x340 | 4;
      }
    }
    else if ((uVar1 == 0x4b) && ((this_00->field_0x340 & 0x10) != 0)) {
      if ((this_00->effectiveTextFormat == PlainText) &&
         (((this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
           super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) == 0)) {
        FVar7 = QWidget::focusPolicy
                          (*(QWidget **)
                            &(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8);
        if (FVar7 == NoFocus) goto LAB_00418980;
      }
      QLabelPrivate::ensureTextControl(this_00);
    }
  }
  else if (uVar1 == 100) {
    QWidgetPrivate::setLayoutItemMargins
              ((QWidgetPrivate *)this_00,SE_LabelLayoutItem,(QStyleOption *)0x0);
    QLabelPrivate::updateLabel(this_00);
  }
  else if (uVar1 == 0x75) {
    iVar2 = *(int *)(e + 0x18);
    iVar3 = this_00->shortcutId;
    bVar5 = 0x75;
    if (iVar2 == iVar3) {
      pDVar4 = (this_00->buddy).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar8 = (QWidget *)0x0;
      }
      else {
        pQVar8 = (QWidget *)(this_00->buddy).wp.value;
      }
      if (pQVar8 == (QWidget *)0x0) {
        bVar5 = QFrame::event(&this->super_QFrame,e);
      }
      else {
        FVar7 = QWidget::focusPolicy(pQVar8);
        if (FVar7 != NoFocus) {
          QWidget::setFocus(pQVar8,ShortcutFocusReason);
        }
        this_01 = (QAbstractButton *)
                  QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
        if ((this_01 == (QAbstractButton *)0x0) || (e[0x1c] != (QEvent)0x0)) {
          pQVar8 = QWidget::window((QWidget *)this);
          QWidget::setAttribute(pQVar8,WA_KeyboardFocusChange,true);
        }
        else {
          QAbstractButton::animateClick(this_01);
        }
        bVar5 = 1;
      }
    }
    if (iVar2 == iVar3) {
      return (bool)(bVar5 & 1);
    }
  }
LAB_00418980:
  bVar6 = QFrame::event(&this->super_QFrame,e);
  return bVar6;
}

Assistant:

bool QLabel::event(QEvent *e)
{
    Q_D(QLabel);
    QEvent::Type type = e->type();

#ifndef QT_NO_SHORTCUT
    if (type == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            QWidget *w = d->buddy;
            if (!w)
                return QFrame::event(e);
            if (w->focusPolicy() != Qt::NoFocus)
                w->setFocus(Qt::ShortcutFocusReason);
#if QT_CONFIG(abstractbutton)
            QAbstractButton *button = qobject_cast<QAbstractButton *>(w);
            if (button && !se->isAmbiguous())
                button->animateClick();
            else
#endif
                window()->setAttribute(Qt::WA_KeyboardFocusChange);
            return true;
        }
    } else
#endif
    if (type == QEvent::Resize) {
        if (d->control)
            d->textLayoutDirty = true;
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->setLayoutItemMargins(QStyle::SE_LabelLayoutItem);
        d->updateLabel();
    } else if (type == QEvent::Polish) {
        if (d->needTextControl())
            d->ensureTextControl();
    }

    return QFrame::event(e);
}